

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

Token * MyCompiler::nextToken(Token *__return_storage_ptr__,istream *stream)

{
  SymbolType SVar1;
  pos_type offset;
  initializer_list<std::pair<const_char,_State>_> __l;
  initializer_list<std::pair<const_char,_MyCompiler::SymbolType>_> __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>
  __l_01;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  streamoff __off;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  pointer pvVar8;
  LexicalError *pLVar9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  *local_550;
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
  local_470;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
  local_468;
  const_iterator search;
  allocator local_439;
  string local_438 [38];
  char local_412;
  allocator local_411;
  string local_410 [6];
  char c_5;
  char local_3ea;
  allocator local_3e9;
  string local_3e8 [6];
  char c_4;
  char local_3c3;
  char local_3c2;
  char local_3c1;
  undefined1 local_3c0 [5];
  char c_3;
  char c_2;
  char c_1;
  fpos<__mbstate_t> local_3b0;
  fpos<__mbstate_t> local_3a0;
  _Node_iterator_base<std::pair<const_char,_State>,_false> local_390;
  _Node_iterator_base<std::pair<const_char,_State>,_false> local_388;
  undefined4 local_380;
  allocator local_379;
  string local_378 [32];
  _Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false> local_358;
  _Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false> local_350;
  char local_345;
  mapped_type local_344;
  string local_340 [3];
  char c;
  State state;
  string buffer;
  allocator<std::pair<const_char,_State>_> local_31b;
  key_equal local_31a;
  hasher local_319;
  pair<const_char,_State> local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  iterator local_300;
  size_type local_2f8;
  allocator<std::pair<const_char,_MyCompiler::SymbolType>_> local_2eb;
  key_equal local_2ea;
  hasher local_2e9;
  pair<const_char,_MyCompiler::SymbolType> local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  iterator local_290;
  size_type local_288;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>
  local_27f;
  key_equal local_27e;
  hasher local_27d;
  SymbolType local_27c [16];
  SymbolType local_23c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  *local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_50;
  iterator local_28;
  size_type local_20;
  istream *local_18;
  istream *stream_local;
  
  local_18 = stream;
  stream_local = (istream *)__return_storage_ptr__;
  if ((nextToken(std::istream&)::keywordsMap_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::keywordsMap_abi_cxx11_), iVar5 != 0)) {
    local_238 = &local_230;
    local_23c = BEGIN;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [6])"begin",&local_23c);
    local_238 = &local_208;
    local_27c[0xb] = 0x14;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [4])"end",local_27c + 0xb);
    local_238 = &local_1e0;
    local_27c[10] = 0x15;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [3])"if",local_27c + 10);
    local_238 = &local_1b8;
    local_27c[9] = 0x16;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [5])"then",local_27c + 9);
    local_238 = &local_190;
    local_27c[8] = 0x17;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [6])"while",local_27c + 8);
    local_238 = &local_168;
    local_27c[7] = 0x18;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [6])"write",local_27c + 7);
    local_238 = &local_140;
    local_27c[6] = 0x19;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [5])"read",local_27c + 6);
    local_238 = &local_118;
    local_27c[5] = 0x1a;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [3])"do",local_27c + 5);
    local_238 = &local_f0;
    local_27c[4] = 0x1b;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [5])"call",local_27c + 4);
    local_238 = &local_c8;
    local_27c[3] = 0x1c;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [6])"const",local_27c + 3);
    local_238 = &local_a0;
    local_27c[2] = 0x1d;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [4])"var",local_27c + 2);
    local_238 = &local_78;
    local_27c[1] = 0x1e;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[10],_MyCompiler::SymbolType,_true>
              (local_238,(char (*) [10])"procedure",local_27c + 1);
    local_238 = &local_50;
    local_27c[0] = ODD;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>(local_238,(char (*) [4])"odd",local_27c)
    ;
    local_28 = &local_230;
    local_20 = 0xd;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>
    ::allocator(&local_27f);
    __l_01._M_len = local_20;
    __l_01._M_array = local_28;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
    ::unordered_map(&nextToken(std::istream&)::keywordsMap_abi_cxx11_,__l_01,0,&local_27d,&local_27e
                    ,&local_27f);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>
    ::~allocator(&local_27f);
    local_550 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
                 *)&local_28;
    do {
      local_550 = local_550 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
      ::~pair(local_550);
    } while (local_550 != &local_230);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::keywordsMap_abi_cxx11_);
  }
  if ((nextToken(std::istream&)::startCharsSymbolTypeMap == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsSymbolTypeMap), iVar5 != 0))
  {
    local_2a8 = 0xf0000002c;
    uStack_2a0 = 0x100000003b;
    local_2b8 = 0xd00000028;
    uStack_2b0 = 0xe00000029;
    local_2c8 = 0x70000003d;
    uStack_2c0 = 0x800000023;
    local_2d8 = 0x50000002a;
    uStack_2d0 = 0x60000002f;
    local_2e8.first = '+';
    local_2e8._1_3_ = 0;
    local_2e8.second = PLUS;
    uStack_2e0 = 0x40000002d;
    local_298 = 0x110000002e;
    local_290 = &local_2e8;
    local_288 = 0xb;
    std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>::allocator(&local_2eb);
    __l_00._M_len = local_288;
    __l_00._M_array = local_290;
    std::
    unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
    ::unordered_map(&nextToken::startCharsSymbolTypeMap,__l_00,0,&local_2e9,&local_2ea,&local_2eb);
    std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>::~allocator(&local_2eb);
    __cxa_atexit(std::
                 unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken::startCharsSymbolTypeMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsSymbolTypeMap);
  }
  if ((nextToken(std::istream&)::startCharsStateMap == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsStateMap), iVar5 != 0)) {
    local_318.first = '<';
    local_318._1_3_ = 0;
    local_318.second = LT;
    uStack_310 = 0x40000003e;
    local_308 = 0x50000003a;
    local_300 = &local_318;
    local_2f8 = 3;
    std::allocator<std::pair<const_char,_State>_>::allocator(&local_31b);
    __l._M_len = local_2f8;
    __l._M_array = local_300;
    std::
    unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
    ::unordered_map(&nextToken::startCharsStateMap,__l,0,&local_319,&local_31a,&local_31b);
    std::allocator<std::pair<const_char,_State>_>::~allocator(&local_31b);
    __cxa_atexit(std::
                 unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                 ::~unordered_map,&nextToken::startCharsStateMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsStateMap);
  }
  std::__cxx11::string::string(local_340);
  local_344 = START;
LAB_0011ba94:
  do {
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
LAB_0011c3c5:
      if (local_344 == WORD) {
        __first._M_current = (char *)std::__cxx11::string::begin();
        __last._M_current = (char *)std::__cxx11::string::end();
        __result._M_current = (char *)std::__cxx11::string::begin();
        search.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
                   )std::
                    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                              (__first,__last,__result,tolower);
        local_468._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
             ::find(&nextToken(std::istream&)::keywordsMap_abi_cxx11_,(key_type *)local_340);
        local_470._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
             ::end(&nextToken(std::istream&)::keywordsMap_abi_cxx11_);
        bVar4 = std::__detail::operator!=(&local_468,&local_470);
        if (bVar4) {
          pvVar8 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_false,_true>
                                 *)&local_468);
          SVar1 = pvVar8->second;
          std::__cxx11::string::string(local_490,local_340);
          Token::Token(__return_storage_ptr__,SVar1,(string *)local_490);
          std::__cxx11::string::~string(local_490);
        }
        else {
          std::__cxx11::string::string(local_4b0,local_340);
          Token::Token(__return_storage_ptr__,IDENT,(string *)local_4b0);
          std::__cxx11::string::~string(local_4b0);
        }
      }
      else if (local_344 == NUM) {
        std::__cxx11::string::string(local_4d0,local_340);
        Token::Token(__return_storage_ptr__,NUMBER,(string *)local_4d0);
        std::__cxx11::string::~string(local_4d0);
      }
      else if (local_344 == LT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4f0,"<",&local_4f1);
        Token::Token(__return_storage_ptr__,LSS,(string *)local_4f0);
        std::__cxx11::string::~string(local_4f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      }
      else if (local_344 == GT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_518,">",&local_519);
        Token::Token(__return_storage_ptr__,GTR,(string *)local_518);
        std::__cxx11::string::~string(local_518);
        std::allocator<char>::~allocator((allocator<char> *)&local_519);
      }
      else {
        if (local_344 == COLON) {
          pLVar9 = (LexicalError *)__cxa_allocate_exception(0x20);
          offset = (pos_type)std::istream::tellg();
          LexicalError::LexicalError(pLVar9,offset);
          __cxa_throw(pLVar9,&LexicalError::typeinfo,LexicalError::~LexicalError);
        }
        Token::Token(__return_storage_ptr__,NUL);
      }
LAB_0011c84e:
      local_380 = 1;
      std::__cxx11::string::~string(local_340);
      return __return_storage_ptr__;
    }
    if (local_344 != START) {
      if (local_344 == WORD) {
        local_3c1 = std::istream::peek();
        iVar5 = isalnum((int)local_3c1);
        if (iVar5 == 0) goto LAB_0011c3c5;
        std::istream::get();
        std::__cxx11::string::push_back((char)local_340);
      }
      else {
        if (local_344 != NUM) {
          if (local_344 == LT) {
            local_3c3 = std::istream::peek();
            if (local_3c3 == '=') {
              std::istream::get();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3e8,"<=",&local_3e9);
              Token::Token(__return_storage_ptr__,LEQ,(string *)local_3e8);
              std::__cxx11::string::~string(local_3e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
              goto LAB_0011c84e;
            }
          }
          else if (local_344 == GT) {
            local_3ea = std::istream::peek();
            if (local_3ea == '=') {
              std::istream::get();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_410,">=",&local_411);
              Token::Token(__return_storage_ptr__,GEQ,(string *)local_410);
              std::__cxx11::string::~string(local_410);
              std::allocator<char>::~allocator((allocator<char> *)&local_411);
              goto LAB_0011c84e;
            }
          }
          else {
            local_412 = std::istream::peek();
            if (local_412 == '=') {
              std::istream::get();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_438,":=",&local_439);
              Token::Token(__return_storage_ptr__,BECOMES,(string *)local_438);
              std::__cxx11::string::~string(local_438);
              std::allocator<char>::~allocator((allocator<char> *)&local_439);
              goto LAB_0011c84e;
            }
          }
          goto LAB_0011c3c5;
        }
        local_3c2 = std::istream::peek();
        iVar5 = isdigit((int)local_3c2);
        if (iVar5 == 0) goto LAB_0011c3c5;
        std::istream::get();
        std::__cxx11::string::push_back((char)local_340);
      }
      goto LAB_0011ba94;
    }
    std::ws<char,std::char_traits<char>>(local_18);
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) goto LAB_0011c3c5;
    local_345 = std::istream::peek();
    iVar5 = isalpha((int)local_345);
    if (iVar5 == 0) {
      iVar5 = isdigit((int)local_345);
      if (iVar5 == 0) {
        local_350._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
             ::find(&nextToken::startCharsSymbolTypeMap,&local_345);
        local_358._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
             ::end(&nextToken::startCharsSymbolTypeMap);
        bVar4 = std::__detail::operator!=(&local_350,&local_358);
        if (bVar4) {
          std::istream::get();
          pmVar6 = std::
                   unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
                   ::at(&nextToken::startCharsSymbolTypeMap,&local_345);
          cVar2 = local_345;
          SVar1 = *pmVar6;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_378,1,cVar2,&local_379);
          Token::Token(__return_storage_ptr__,SVar1,(string *)local_378);
          std::__cxx11::string::~string(local_378);
          std::allocator<char>::~allocator((allocator<char> *)&local_379);
          goto LAB_0011c84e;
        }
        local_388._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
             ::find(&nextToken::startCharsStateMap,&local_345);
        local_390._M_cur =
             (__node_type *)
             std::
             unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
             ::end(&nextToken::startCharsStateMap);
        bVar4 = std::__detail::operator!=(&local_388,&local_390);
        if (!bVar4) {
          pLVar9 = (LexicalError *)__cxa_allocate_exception(0x20);
          local_3b0 = (fpos<__mbstate_t>)std::istream::tellg();
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_3c0,1);
          __off = std::fpos::operator_cast_to_long((fpos *)local_3c0);
          local_3a0 = std::fpos<__mbstate_t>::operator+(&local_3b0,__off);
          LexicalError::LexicalError(pLVar9,local_3a0);
          __cxa_throw(pLVar9,&LexicalError::typeinfo,LexicalError::~LexicalError);
        }
        std::istream::get();
        pmVar7 = std::
                 unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                 ::at(&nextToken::startCharsStateMap,&local_345);
        local_344 = *pmVar7;
      }
      else {
        std::istream::get();
        std::__cxx11::string::push_back((char)local_340);
        local_344 = NUM;
      }
    }
    else {
      std::istream::get();
      std::__cxx11::string::push_back((char)local_340);
      local_344 = WORD;
    }
  } while( true );
}

Assistant:

MyCompiler::Token MyCompiler::nextToken(std::istream &stream)
{
    enum class State
    {
        START, WORD, NUM, LT, GT, COLON
    };
    static const std::unordered_map<std::string, SymbolType> keywordsMap = {
            {"begin",     SymbolType::BEGIN},
            {"end",       SymbolType::END},
            {"if",        SymbolType::IF},
            {"then",      SymbolType::THEN},
            {"while",     SymbolType::WHILE},
            {"write",     SymbolType::WRITE},
            {"read",      SymbolType::READ},
            {"do",        SymbolType::DO},
            {"call",      SymbolType::CALL},
            {"const",     SymbolType::CONST},
            {"var",       SymbolType::VAR},
            {"procedure", SymbolType::PROC},
            {"odd",       SymbolType::ODD}
    };
    static const std::unordered_map<char, SymbolType> startCharsSymbolTypeMap = {
            {'+', SymbolType::PLUS},
            {'-', SymbolType::MINUS},
            {'*', SymbolType::TIMES},
            {'/', SymbolType::SLASH},
            {'=', SymbolType::EQL},
            {'#', SymbolType::NEQ},
            {'(', SymbolType::LPAREN},
            {')', SymbolType::RPAREN},
            {',', SymbolType::COMMA},
            {';', SymbolType::SEMICOLON},
            {'.', SymbolType::PERIOD}
    };
    static const std::unordered_map<char, State> startCharsStateMap = {
            {'<', State::LT},
            {'>', State::GT},
            {':', State::COLON}
    };

    std::string buffer;
    State state = State::START;
    while (stream.good())
    {
        if (state == State::START)
        {
            std::ws(stream);
            if (!stream.good())
                break;
            char c = stream.peek();
            if (std::isalpha(c))
            {
                buffer.push_back(stream.get());
                state = State::WORD;
            }
            else if (std::isdigit(c))
            {
                buffer.push_back(stream.get());
                state = State::NUM;
            }
            else if (startCharsSymbolTypeMap.find(c) != startCharsSymbolTypeMap.end())
            {
                stream.get();
                return Token(startCharsSymbolTypeMap.at(c), std::string(1, c));
            }
            else if (startCharsStateMap.find(c) != startCharsStateMap.end())
            {
                stream.get();
                state = startCharsStateMap.at(c);
            }
            else
                throw LexicalError(stream.tellg() + std::ios::pos_type(1));
        }
        else if (state == State::WORD)
        {
            char c = stream.peek();
            if (std::isalnum(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::NUM)
        {
            char c = stream.peek();
            if (std::isdigit(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::LT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::LEQ, "<=");
            }
            else
                break;
        }
        else if (state == State::GT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::GEQ, ">=");
            }
            else
                break;
        }
        else // if (state == State::COLON)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::BECOMES, ":=");
            }
            else
                break;
        }
    }
    if (state == State::WORD)
    {
        std::transform(buffer.begin(), buffer.end(), buffer.begin(), ::tolower);
        auto search = keywordsMap.find(buffer);
        if (search != keywordsMap.end())
            return Token(search->second, buffer);
        else
            return Token(SymbolType::IDENT, buffer);
    }
    else if (state == State::NUM)
        return Token(SymbolType::NUMBER, buffer);
    else if (state == State::LT)
        return Token(SymbolType::LSS, "<");
    else if (state == State::GT)
        return Token(SymbolType::GTR, ">");
    else if (state == State::COLON)
        throw LexicalError(stream.tellg());
    else
        return Token(SymbolType::NUL);
}